

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  bool bVar1;
  LogMessage *other;
  string *psVar2;
  FileOptions *this_00;
  FileOptions *from_00;
  SourceCodeInfo *this_01;
  SourceCodeInfo *from_01;
  UnknownFieldSet *this_02;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FileDescriptorProto *local_18;
  FileDescriptorProto *from_local;
  FileDescriptorProto *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x605);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->dependency_,&local_18->dependency_);
  RepeatedField<int>::MergeFrom(&this->public_dependency_,&local_18->public_dependency_);
  RepeatedField<int>::MergeFrom(&this->weak_dependency_,&local_18->weak_dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            (&this->message_type_,&local_18->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            (&this->enum_type_,&local_18->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::MergeFrom
            (&this->service_,&local_18->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&this->extension_,&local_18->extension_);
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(local_18);
    if (bVar1) {
      psVar2 = name_abi_cxx11_(local_18);
      set_name(this,psVar2);
    }
    bVar1 = has_package(local_18);
    if (bVar1) {
      psVar2 = package_abi_cxx11_(local_18);
      set_package(this,psVar2);
    }
  }
  if ((local_18->_has_bits_[0] & 0x1fe00) != 0) {
    bVar1 = has_options(local_18);
    if (bVar1) {
      this_00 = mutable_options(this);
      from_00 = options(local_18);
      FileOptions::MergeFrom(this_00,from_00);
    }
    bVar1 = has_source_code_info(local_18);
    if (bVar1) {
      this_01 = mutable_source_code_info(this);
      from_01 = source_code_info(local_18);
      SourceCodeInfo::MergeFrom(this_01,from_01);
    }
  }
  this_02 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_02,other_00);
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  dependency_.MergeFrom(from.dependency_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_package()) {
      set_package(from.package());
    }
  }
  if (from._has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FileOptions::MergeFrom(from.options());
    }
    if (from.has_source_code_info()) {
      mutable_source_code_info()->::google::protobuf::SourceCodeInfo::MergeFrom(from.source_code_info());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}